

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

string * anon_unknown.dwarf_ec6a::codecvt_u32_to_u8(string *__return_storage_ptr__,u32string *u32)

{
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  wStack_78;
  
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::wstring_convert(&wStack_78);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&wStack_78,u32);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char32_t,_1114111UL,_(std::codecvt_mode)0>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::~wstring_convert(&wStack_78);
  return __return_storage_ptr__;
}

Assistant:

inline
string codecvt_u32_to_u8(const u32string& u32)
{
    using codecvt = std::codecvt_utf8<char32_t>;
    return std::wstring_convert<codecvt, char32_t>{}.to_bytes(u32);
}